

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O2

Few<r3d::Plane<2>,_3> *
r3d::faces_from_verts
          (Few<r3d::Plane<2>,_3> *__return_storage_ptr__,Few<r3d::Vector<2>,_3> *vertices)

{
  long lVar1;
  long lVar2;
  UninitT *rhs;
  UninitT *rhs_00;
  Vector<2> p1;
  Vector<2> p0;
  UninitT local_70;
  double local_68;
  UninitT local_60;
  double local_58;
  Few<double,_2> local_50;
  r3d local_40 [16];
  
  p0.super_Few<double,_2>.array_[0] = (UninitT)0x0;
  p0.super_Few<double,_2>.array_[1] = (UninitT)0x0;
  p1.super_Few<double,_2>.array_[0] = (UninitT)0x0;
  p1.super_Few<double,_2>.array_[1] = (UninitT)0x0;
  Few<r3d::Plane<2>,_3>::Few(__return_storage_ptr__);
  lVar1 = -3;
  rhs = __return_storage_ptr__->array_;
  rhs_00 = vertices->array_;
  while (lVar1 != 0) {
    Few<double,_2>::operator=(&p0.super_Few<double,_2>,(Few<double,_2> *)&rhs_00->__align);
    lVar2 = lVar1 + 4;
    lVar1 = lVar1 + 1;
    if (lVar1 == 0) {
      lVar2 = 0;
    }
    Few<double,_2>::operator=
              (&p1.super_Few<double,_2>,(Few<double,_2> *)&vertices->array_[lVar2].__align);
    *(double *)rhs =
         (double)p0.super_Few<double,_2>.array_[1] - (double)p1.super_Few<double,_2>.array_[1];
    *(double *)((long)rhs + 8) =
         (double)p1.super_Few<double,_2>.array_[0] - (double)p0.super_Few<double,_2>.array_[0];
    Few<double,_2>::Few(&local_50,(Few<double,_2> *)&rhs->__align);
    normalize<2>(local_40,(Vector<2> *)&local_50);
    Few<double,_2>::operator=((Few<double,_2> *)&rhs->__align,(Few<double,_2> *)local_40);
    Few<double,_2>::Few((Few<double,_2> *)&local_60.__align,(Few<double,_2> *)&rhs->__align);
    Few<double,_2>::Few((Few<double,_2> *)&local_70.__align,&p0.super_Few<double,_2>);
    *(double *)((long)rhs + 0x10) = -(local_58 * local_68 + (double)local_60 * (double)local_70);
    rhs = rhs + 1;
    rhs_00 = rhs_00 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

R3D_INLINE Few<Plane<2>, 3> faces_from_verts(Few<Vector<2>, 3> vertices) {
  constexpr Int numverts = 3;
  Int f;
  Vector<2> p0, p1;
  Few<Plane<2>, 3> faces;
  // calculate a centroid and a unit normal for each face
  for (f = 0; f < numverts; ++f) {
    p0 = vertices[f];
    p1 = vertices[(f + 1) % numverts];
    // normal of the edge
    faces[f].n[0] = p0[1] - p1[1];
    faces[f].n[1] = p1[0] - p0[0];
    // normalize the normals and set the signed distance to origin
    faces[f].n = normalize(faces[f].n);
    faces[f].d = -(faces[f].n * p0);
  }
  return faces;
}